

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O3

Matrix3d * opengv::generateRandomRotation(Matrix3d *__return_storage_ptr__,double maxAngle)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  long lVar10;
  ActualDstType actualDst;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Matrix3d R2;
  Matrix3d R1;
  undefined8 local_118;
  undefined8 uStack_110;
  double local_108 [3];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  double local_d8;
  double local_d0 [7];
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  double local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  double local_38;
  undefined1 extraout_var [56];
  
  iVar8 = rand();
  local_118 = (double)iVar8 / 2147483647.0;
  iVar8 = rand();
  iVar9 = rand();
  local_90 = 0;
  dVar15 = maxAngle + maxAngle;
  local_118 = dVar15 * (local_118 + -0.5);
  dVar14 = dVar15 * ((double)iVar8 / 2147483647.0 + -0.5);
  dVar15 = dVar15 * ((double)iVar9 / 2147483647.0 + -0.5);
  dVar13 = cos(local_118);
  local_d0[6] = dVar13;
  local_98 = sin(local_118);
  local_118 = -0.0;
  uStack_110 = 0x8000000000000000;
  auVar11._0_8_ = -local_98;
  auVar11._8_4_ = (int)extraout_XMM0_Qb;
  auVar11._12_4_ = (uint)((ulong)extraout_XMM0_Qb >> 0x20) ^ 0x80000000;
  local_88 = vmovlps_avx(auVar11);
  local_d0[2] = 1.0;
  local_d0[3] = 0.0;
  local_d0[4] = 0.0;
  local_d0[5] = 0.0;
  local_80 = dVar13;
  dVar13 = cos(dVar14);
  local_108[0] = dVar13;
  local_d8 = sin(dVar14);
  local_f0 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar16._0_4_ = SUB84(local_d8,0) ^ (uint)local_118;
  auVar16._4_4_ = (uint)((ulong)local_d8 >> 0x20) ^ local_118._4_4_;
  auVar16._8_4_ = (uint)extraout_XMM0_Qb_00 ^ (uint)uStack_110;
  auVar16._12_4_ = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20) ^ uStack_110._4_4_;
  local_108[1] = 0.0;
  local_d0[0] = 0.0;
  local_108[2] = (double)vmovlps_avx(auVar16);
  local_e0 = 0;
  local_d0[1] = dVar13;
  dVar14 = cos(dVar15);
  auVar18._0_8_ = sin(dVar15);
  auVar18._8_56_ = extraout_var;
  auVar19._0_8_ = (ulong)auVar18._0_8_ ^ (ulong)local_118;
  auVar19._8_8_ = extraout_var._0_8_ ^ uStack_110;
  auVar12._8_8_ = extraout_XMM0_Qb_01;
  auVar12._0_8_ = dVar14;
  lVar10 = 0x10;
  auVar16 = vunpcklpd_avx(auVar12,auVar18._0_16_);
  auVar12 = vunpcklpd_avx(auVar19,auVar12);
  do {
    auVar2._8_8_ = *(undefined8 *)((long)&local_118 + lVar10);
    auVar2._0_8_ = *(undefined8 *)((long)&local_118 + lVar10);
    auVar11 = vmulpd_avx512vl(auVar16,auVar2);
    dVar15 = *(double *)((long)local_108 + lVar10);
    auVar23._8_8_ = dVar15;
    auVar23._0_8_ = dVar15;
    auVar3._8_8_ = *(undefined8 *)((long)&uStack_110 + lVar10);
    auVar3._0_8_ = *(undefined8 *)((long)&uStack_110 + lVar10);
    auVar11 = vfmadd231pd_avx512vl(auVar11,auVar12,auVar3);
    auVar11 = vfmadd231pd_fma(auVar11,auVar23,ZEXT816(0) << 0x40);
    *(undefined1 (*) [16])((long)&local_88 + lVar10) = auVar11;
    auVar25._0_8_ = *(double *)((long)&local_118 + lVar10) * 0.0;
    auVar25._8_8_ = *(double *)((long)&uStack_110 + lVar10) * 0.0;
    auVar11 = vshufpd_avx(auVar25,auVar25,1);
    *(double *)(local_78 + lVar10) = auVar25._0_8_ + auVar11._0_8_ + dVar15;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x58);
  auVar6._8_8_ = uStack_60;
  auVar6._0_8_ = local_68;
  auVar7._8_8_ = uStack_58;
  auVar7._0_8_ = uStack_60;
  lVar10 = 0x10;
  auVar16 = vmovhpd_avx(auVar6,local_50);
  do {
    auVar4._8_8_ = *(undefined8 *)((long)local_d0 + lVar10);
    auVar4._0_8_ = *(undefined8 *)((long)local_d0 + lVar10);
    auVar12 = vmulpd_avx512vl(local_78,auVar4);
    dVar15 = *(double *)((long)local_d0 + lVar10 + 0x10);
    auVar33._8_8_ = dVar15;
    auVar33._0_8_ = dVar15;
    auVar39._0_8_ = auVar16._0_8_ * *(double *)((long)local_d0 + lVar10);
    auVar39._8_8_ = auVar16._8_8_ * *(double *)((long)local_d0 + lVar10 + 8);
    uVar1 = *(undefined8 *)((long)local_d0 + lVar10 + 8);
    auVar5._8_8_ = uVar1;
    auVar5._0_8_ = uVar1;
    auVar12 = vfmadd231pd_avx512vl(auVar12,auVar7,auVar5);
    auVar12 = vfmadd231pd_fma(auVar12,local_48,auVar33);
    *(undefined1 (*) [16])
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar10 + -0x10) = auVar12;
    auVar12 = vshufpd_avx(auVar39,auVar39,1);
    *(double *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar10) = auVar39._0_8_ + auVar12._0_8_ + local_38 * dVar15;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x58);
  auVar16 = *(undefined1 (*) [16])
             (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
             m_storage.m_data.array;
  dVar15 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar15 * dVar15 + auVar16._0_8_ * auVar16._0_8_ + auVar16._8_8_ * auVar16._8_8_;
  auVar12 = vsqrtpd_avx(auVar20);
  dVar14 = auVar12._0_8_;
  auVar26._8_8_ = dVar14;
  auVar26._0_8_ = dVar14;
  auVar21._0_8_ = dVar15 / dVar14;
  auVar21._8_8_ = 0;
  auVar16 = vdivpd_avx(auVar16,auVar26);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
   m_data.array = auVar16;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = auVar21._0_8_;
  auVar11 = vshufpd_avx(auVar16,auVar16,1);
  dVar15 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[4];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar15;
  dVar14 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[5];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar14;
  dVar13 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[3];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar13;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar15 * auVar21._0_8_;
  auVar12 = vfmsub231sd_fma(auVar34,auVar11,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar14 * auVar16._0_8_;
  auVar19 = vfmsub231sd_fma(auVar28,auVar21,auVar36);
  auVar19 = vunpcklpd_avx(auVar12,auVar19);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar13 * auVar11._0_8_;
  auVar2 = vfmsub231sd_fma(auVar35,auVar16,auVar30);
  dVar14 = auVar2._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar14 * dVar14 + auVar19._0_8_ * auVar19._0_8_ + auVar19._8_8_ * auVar19._8_8_;
  auVar12 = vsqrtpd_avx(auVar31);
  dVar15 = auVar12._0_8_;
  auVar37._8_8_ = dVar15;
  auVar37._0_8_ = dVar15;
  auVar32._0_8_ = dVar14 / dVar15;
  auVar32._8_8_ = auVar2._8_8_;
  auVar12 = vdivpd_avx(auVar19,auVar37);
  auVar19 = vshufpd_avx(auVar12,auVar12,1);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array + 6) = auVar12;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = auVar32._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar11._0_8_ * auVar32._0_8_;
  auVar2 = vfmsub231sd_fma(auVar38,auVar19,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar21._0_8_ * auVar12._0_8_;
  auVar3 = vfmsub231sd_fma(auVar22,auVar16,auVar32);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar16._0_8_ * auVar19._0_8_;
  auVar16 = vfmsub231sd_fma(auVar17,auVar12,auVar11);
  auVar12 = vunpcklpd_avx(auVar2,auVar3);
  dVar15 = auVar16._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar15 * dVar15 + auVar12._0_8_ * auVar12._0_8_ + auVar12._8_8_ * auVar12._8_8_;
  auVar16 = vsqrtpd_avx(auVar24);
  dVar14 = auVar16._0_8_;
  auVar29._8_8_ = dVar14;
  auVar29._0_8_ = dVar14;
  auVar16 = vdivpd_avx(auVar12,auVar29);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array + 3) = auVar16;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar15 / dVar14;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::generateRandomRotation( double maxAngle )
{
  Eigen::Vector3d rpy;
  rpy[0] = ((double) rand())/ ((double) RAND_MAX);
  rpy[1] = ((double) rand())/ ((double) RAND_MAX);
  rpy[2] = ((double) rand())/ ((double) RAND_MAX);

  rpy[0] = maxAngle*2.0*(rpy[0]-0.5);
  rpy[1] = maxAngle*2.0*(rpy[1]-0.5);
  rpy[2] = maxAngle*2.0*(rpy[2]-0.5);

  Matrix3d R1;
  R1(0,0) = 1.0;
  R1(0,1) = 0.0;
  R1(0,2) = 0.0;
  R1(1,0) = 0.0;
  R1(1,1) = cos(rpy[0]);
  R1(1,2) = -sin(rpy[0]);
  R1(2,0) = 0.0;
  R1(2,1) = -R1(1,2);
  R1(2,2) = R1(1,1);

  Matrix3d R2;
  R2(0,0) = cos(rpy[1]);
  R2(0,1) = 0.0;
  R2(0,2) = sin(rpy[1]);
  R2(1,0) = 0.0;
  R2(1,1) = 1.0;
  R2(1,2) = 0.0;
  R2(2,0) = -R2(0,2);
  R2(2,1) = 0.0;
  R2(2,2) = R2(0,0);

  Matrix3d R3;
  R3(0,0) = cos(rpy[2]);
  R3(0,1) = -sin(rpy[2]);
  R3(0,2) = 0.0;
  R3(1,0) =-R3(0,1);
  R3(1,1) = R3(0,0);
  R3(1,2) = 0.0;
  R3(2,0) = 0.0;
  R3(2,1) = 0.0;
  R3(2,2) = 1.0;

  Matrix3d rotation = R3 * R2 * R1;

  rotation.col(0) = rotation.col(0) / rotation.col(0).norm();
  rotation.col(2) = rotation.col(0).cross(rotation.col(1));
  rotation.col(2) = rotation.col(2) / rotation.col(2).norm();
  rotation.col(1) = rotation.col(2).cross(rotation.col(0));
  rotation.col(1) = rotation.col(1) / rotation.col(1).norm();

  return rotation;
}